

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<RTGPartition> * __thiscall
pybind11::class_<RTGPartition>::
def<std::unordered_map<std::pair<long,long>,std::vector<long,std::allocator<long>>,std::hash<std::pair<long,long>>,std::equal_to<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,std::vector<long,std::allocator<long>>>>>(RTGPartition::*)(int,int),pybind11::arg,pybind11::arg>
          (class_<RTGPartition> *this,char *name_,offset_in_Node_to_subr *f,arg *extra,arg *extra_1)

{
  offset_in_Node_to_subr f_00;
  name *extra_00;
  handle local_68;
  cpp_function cf;
  object local_58;
  arg *local_50;
  handle local_48;
  is_method local_40;
  PyObject *local_38;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_48.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_58.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_50 = extra;
  local_40.class_.m_ptr = (handle)(handle)name_;
  local_68.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_68.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_68.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_38 = local_68.m_ptr;
  cpp_function::
  cpp_function<std::unordered_map<std::pair<long,long>,std::vector<long,std::allocator<long>>,std::hash<std::pair<long,long>>,std::equal_to<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,std::vector<long,std::allocator<long>>>>>,RTGPartition,int,int,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg>
            (&cf,f_00,extra_00,&local_40,(sibling *)&local_48,(arg *)&local_38,local_50);
  object::~object((object *)&local_68);
  object::~object(&local_58);
  detail::add_class_method((object *)this,name_,&cf);
  object::~object((object *)&cf);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }